

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_SENSITIVE_Unmarshal(TPMT_SENSITIVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_SENSITIVE *target_local;
  
  target_local._4_4_ = TPMI_ALG_PUBLIC_Unmarshal(&target->sensitiveType,buffer,size);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->authValue,buffer,size),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->seedValue,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ =
         TPMU_SENSITIVE_COMPOSITE_Unmarshal
                   (&target->sensitive,buffer,size,(uint)target->sensitiveType);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMT_SENSITIVE_Unmarshal(TPMT_SENSITIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_ALG_PUBLIC_Unmarshal((TPMI_ALG_PUBLIC *)&(target->sensitiveType), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_AUTH_Unmarshal((TPM2B_AUTH *)&(target->authValue), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->seedValue), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SENSITIVE_COMPOSITE_Unmarshal((TPMU_SENSITIVE_COMPOSITE *)&(target->sensitive), buffer, size, (UINT32)target->sensitiveType);
    return result;
}